

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::close_connection(session_impl *this,peer_connection *p)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  const_iterator __position;
  shared_ptr<libtorrent::aux::peer_connection> sp;
  value_type local_18;
  
  ::std::__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libtorrent::aux::peer_connection,void>
            ((__shared_ptr<libtorrent::aux::peer_connection,(__gnu_cxx::_Lock_policy)2> *)&local_18,
             (__weak_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2> *)
             &p->super_enable_shared_from_this<libtorrent::aux::peer_connection>);
  p_Var2 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
    __position._M_node = &p_Var1->_M_header;
    do {
      if (*(element_type **)(p_Var2 + 1) >=
          local_18.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr) {
        __position._M_node = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)
               [*(element_type **)(p_Var2 + 1) <
                local_18.
                super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
       (*(element_type **)(__position._M_node + 1) <=
        local_18.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)) {
      ::std::
      _Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,std::shared_ptr<libtorrent::aux::peer_connection>,std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
      ::erase_abi_cxx11_((_Rb_tree<std::shared_ptr<libtorrent::aux::peer_connection>,std::shared_ptr<libtorrent::aux::peer_connection>,std::_Identity<std::shared_ptr<libtorrent::aux::peer_connection>>,std::less<std::shared_ptr<libtorrent::aux::peer_connection>>,std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>>>
                          *)&this->m_connections,__position);
      if ((local_18.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (2 < (local_18.
               super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count)) {
        ::std::
        vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
        ::push_back(&this->m_undead_peers,&local_18);
      }
    }
  }
  if (local_18.super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.
               super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void session_impl::close_connection(peer_connection* p) noexcept
	{
		TORRENT_ASSERT(is_single_thread());
		std::shared_ptr<peer_connection> sp(p->self());

		TORRENT_ASSERT(p->is_disconnecting());

		auto const i = m_connections.find(sp);
		// make sure the next disk peer round-robin cursor stays valid
		if (i != m_connections.end())
		{
			m_connections.erase(i);

			TORRENT_ASSERT(std::find(m_undead_peers.begin()
				, m_undead_peers.end(), sp) == m_undead_peers.end());

			// someone else is holding a reference, it's important that
			// it's destructed from the network thread. Make sure the
			// last reference is held by the network thread.
			TORRENT_ASSERT_VAL(m_undead_peers.capacity() > m_undead_peers.size()
				, m_undead_peers.capacity());
			if (sp.use_count() > 2)
				m_undead_peers.push_back(sp);
		}
	}